

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream_internal
                 (ZSTD_CStream *zcs,void *dict,size_t dictSize,ZSTD_CDict *cdict,
                 ZSTD_CCtx_params *params,unsigned_long_long pledgedSrcSize)

{
  undefined4 in_EAX;
  int iVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  auVar3._0_4_ = -(uint)(0x7fffffe9 < (int)((params->cParams).windowLog - 0x20 ^ 0x80000000));
  auVar3._4_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).chainLog - 0x1f ^ 0x80000000));
  auVar3._8_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).hashLog - 0x1f ^ 0x80000000));
  auVar3._12_4_ = -(uint)(0x7fffffe1 < (int)((params->cParams).searchLog - 0x1f ^ 0x80000000));
  iVar1 = movmskps(in_EAX,auVar3);
  if ((((iVar1 == 0xf) && ((params->cParams).minMatch - 3 < 5)) &&
      ((params->cParams).targetLength < 0x20001)) && ((params->cParams).strategy - ZSTD_fast < 9)) {
    memcpy(&zcs->requestedParams,params,0xd0);
    if (cdict != (ZSTD_CDict *)0x0 && dict != (void *)0x0) {
      __assert_fail("!((dict) && (cdict))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x167c,
                    "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
                   );
    }
    if (dict == (void *)0x0) {
      ZSTD_clearAllDicts(zcs);
      zcs->cdict = cdict;
    }
    else {
      sVar2 = ZSTD_CCtx_loadDictionary_advanced(zcs,dict,dictSize,ZSTD_dlm_byCopy,ZSTD_dct_auto);
      if (0xffffffffffffff88 < sVar2) {
        return sVar2;
      }
    }
    return 0;
  }
  __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x167a,
                "size_t ZSTD_initCStream_internal(ZSTD_CStream *, const void *, size_t, const ZSTD_CDict *, const ZSTD_CCtx_params *, unsigned long long)"
               );
}

Assistant:

size_t ZSTD_initCStream_internal(ZSTD_CStream* zcs,
                    const void* dict, size_t dictSize, const ZSTD_CDict* cdict,
                    const ZSTD_CCtx_params* params,
                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_initCStream_internal");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) , "");
    FORWARD_IF_ERROR( ZSTD_CCtx_setPledgedSrcSize(zcs, pledgedSrcSize) , "");
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));
    zcs->requestedParams = *params;
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */
    if (dict) {
        FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) , "");
    } else {
        /* Dictionary is cleared if !cdict */
        FORWARD_IF_ERROR( ZSTD_CCtx_refCDict(zcs, cdict) , "");
    }
    return 0;
}